

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O3

void encode_cache_cpuid4(CPUCacheInfo *cache,int num_apic_ids,int num_cores,uint32_t *eax,
                        uint32_t *ebx,uint32_t *ecx,uint32_t *edx)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  CacheType CVar4;
  uint uVar5;
  
  uVar3 = cache->line_size;
  bVar1 = cache->associativity;
  bVar2 = cache->partitions;
  if (cache->size != (uint)bVar1 * (uint)uVar3 * (uint)bVar2 * cache->sets) {
    __assert_fail("cache->size == cache->line_size * cache->associativity * cache->partitions * cache->sets"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                  ,0xea,
                  "void encode_cache_cpuid4(CPUCacheInfo *, int, int, uint32_t *, uint32_t *, uint32_t *, uint32_t *)"
                 );
  }
  if (num_apic_ids < 1) {
    __assert_fail("num_apic_ids > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                  ,0xec,
                  "void encode_cache_cpuid4(CPUCacheInfo *, int, int, uint32_t *, uint32_t *, uint32_t *, uint32_t *)"
                 );
  }
  CVar4 = cache->type;
  if (CVar4 == DATA_CACHE) {
    uVar5 = 1;
  }
  else if (CVar4 == INSTRUCTION_CACHE) {
    uVar5 = 2;
  }
  else {
    uVar5 = (uint)(CVar4 == UNIFIED_CACHE) * 3;
  }
  *eax = num_apic_ids * 0x4000 - 0x4000U |
         num_cores * 0x4000000 + ((uint)cache->self_init << 8 | (uint)cache->level << 5 | uVar5) +
         0xfc000000;
  if (uVar3 == 0) {
    __assert_fail("cache->line_size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                  ,0xf3,
                  "void encode_cache_cpuid4(CPUCacheInfo *, int, int, uint32_t *, uint32_t *, uint32_t *, uint32_t *)"
                 );
  }
  if (bVar2 == 0) {
    __assert_fail("cache->partitions > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                  ,0xf4,
                  "void encode_cache_cpuid4(CPUCacheInfo *, int, int, uint32_t *, uint32_t *, uint32_t *, uint32_t *)"
                 );
  }
  if (bVar1 != 0) {
    if (cache->sets <= (uint)bVar1) {
      __assert_fail("cache->associativity < cache->sets",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                    ,0xf7,
                    "void encode_cache_cpuid4(CPUCacheInfo *, int, int, uint32_t *, uint32_t *, uint32_t *, uint32_t *)"
                   );
    }
    *ebx = (uint)bVar1 * 0x400000 - 0x400000 | uVar3 - 1 | (uint)bVar2 * 0x1000 - 0x1000;
    if (cache->sets != 0) {
      *ecx = cache->sets - 1;
      *edx = (uint)cache->no_invd_sharing + (uint)cache->inclusive * 2 +
             (uint)cache->complex_indexing * 4;
      return;
    }
    __assert_fail("cache->sets > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                  ,0xfc,
                  "void encode_cache_cpuid4(CPUCacheInfo *, int, int, uint32_t *, uint32_t *, uint32_t *, uint32_t *)"
                 );
  }
  __assert_fail("cache->associativity > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                ,0xf5,
                "void encode_cache_cpuid4(CPUCacheInfo *, int, int, uint32_t *, uint32_t *, uint32_t *, uint32_t *)"
               );
}

Assistant:

static void encode_cache_cpuid4(CPUCacheInfo *cache,
                                int num_apic_ids, int num_cores,
                                uint32_t *eax, uint32_t *ebx,
                                uint32_t *ecx, uint32_t *edx)
{
    assert(cache->size == cache->line_size * cache->associativity *
                          cache->partitions * cache->sets);

    assert(num_apic_ids > 0);
    *eax = CACHE_TYPE(cache->type) |
           CACHE_LEVEL(cache->level) |
           (cache->self_init ? CACHE_SELF_INIT_LEVEL : 0) |
           ((num_cores - 1) << 26) |
           ((num_apic_ids - 1) << 14);

    assert(cache->line_size > 0);
    assert(cache->partitions > 0);
    assert(cache->associativity > 0);
    /* We don't implement fully-associative caches */
    assert(cache->associativity < cache->sets);
    *ebx = (cache->line_size - 1) |
           ((cache->partitions - 1) << 12) |
           ((cache->associativity - 1) << 22);

    assert(cache->sets > 0);
    *ecx = cache->sets - 1;

    *edx = (cache->no_invd_sharing ? CACHE_NO_INVD_SHARING : 0) |
           (cache->inclusive ? CACHE_INCLUSIVE : 0) |
           (cache->complex_indexing ? CACHE_COMPLEX_IDX : 0);
}